

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngread.c
# Opt level: O1

void png_start_read_image(png_structrp png_ptr)

{
  png_byte pVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  png_bytep ppVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  char *error_message;
  
  if (png_ptr == (png_structrp)0x0) {
    return;
  }
  if ((png_ptr->flags & 0x40) == 0) {
    png_init_read_transformations(png_ptr);
    if (png_ptr->interlaced == '\0') {
      uVar3 = png_ptr->width;
      png_ptr->num_rows = png_ptr->height;
    }
    else {
      uVar3 = png_ptr->height + 7 >> 3;
      if ((png_ptr->transformations & 2) != 0) {
        uVar3 = png_ptr->height;
      }
      png_ptr->num_rows = uVar3;
      uVar3 = (~(uint)""[png_ptr->pass] +
              png_ptr->width + (uint)"\b\b\x04\x04\x02\x02\x01"[png_ptr->pass]) /
              (uint)"\b\b\x04\x04\x02\x02\x01"[png_ptr->pass];
    }
    png_ptr->iwidth = uVar3;
    uVar3 = png_ptr->transformations;
    bVar2 = png_ptr->pixel_depth;
    if (((uVar3 & 4) != 0) && (bVar2 = 8, 7 < png_ptr->bit_depth)) {
      bVar2 = png_ptr->pixel_depth;
    }
    uVar7 = (uint)bVar2;
    if ((uVar3 >> 0xc & 1) != 0) {
      pVar1 = png_ptr->color_type;
      if (pVar1 == '\0') {
        uVar7 = 8;
        if (8 < bVar2) {
          uVar7 = (uint)bVar2;
        }
        uVar7 = uVar7 << (png_ptr->num_trans != 0);
      }
      else if (pVar1 == '\x02') {
        if (png_ptr->num_trans != 0) {
          uVar7 = (uint)((ulong)bVar2 * 0x155555558 >> 0x20);
        }
      }
      else if (pVar1 == '\x03') {
        uVar7 = (uint)(png_ptr->num_trans != 0) * 8 + 0x18;
      }
    }
    if ((uVar3 >> 9 & 1) != 0) {
      if ((uVar3 >> 0xc & 1) == 0) {
        png_ptr->transformations = uVar3 & 0xffffedff;
      }
      else {
        uVar7 = uVar7 << (png_ptr->bit_depth < 0x10);
      }
    }
    uVar3 = png_ptr->transformations;
    if ((short)uVar3 < 0) {
      if (png_ptr->color_type - 2 < 2) {
        uVar7 = (uint)(0x20 < uVar7) * 0x20 + 0x20;
      }
      else if (png_ptr->color_type == 0) {
        uVar7 = (uint)(8 < uVar7) * 0x10 + 0x10;
      }
    }
    if ((uVar3 >> 0xe & 1) != 0) {
      if ((((short)uVar3 < 0) || (((byte)(uVar3 >> 0xc) & png_ptr->num_trans != 0) != 0)) ||
         (pVar1 = png_ptr->color_type, pVar1 == '\x04')) {
        uVar7 = (uint)(0x10 < uVar7) * 0x20 + 0x20;
      }
      else if (uVar7 < 9) {
        uVar7 = (uint)(pVar1 == '\x06') * 8 + 0x18;
      }
      else {
        uVar7 = (uint)(pVar1 == '\x06') * 0x10 + 0x30;
      }
    }
    uVar8 = uVar7;
    if (((uVar3 >> 0x14 & 1) != 0) &&
       (uVar8 = (uint)png_ptr->user_transform_channels * (uint)png_ptr->user_transform_depth,
       uVar8 <= uVar7)) {
      uVar8 = uVar7;
    }
    png_ptr->maximum_pixel_depth = (png_byte)uVar8;
    png_ptr->transformed_pixel_depth = '\0';
    uVar6 = (ulong)(png_ptr->width + 7 & 0xfffffff8);
    if (uVar8 < 8) {
      uVar6 = uVar6 * uVar8 >> 3;
    }
    else {
      uVar6 = uVar6 * (uVar8 >> 3);
    }
    uVar6 = (uVar8 + 7 >> 3) + uVar6 + 0x31;
    if (png_ptr->old_big_row_buf_size < uVar6) {
      png_free(png_ptr,png_ptr->big_row_buf);
      png_free(png_ptr,png_ptr->big_prev_row);
      if (png_ptr->interlaced == '\0') {
        ppVar5 = (png_bytep)png_malloc(png_ptr,uVar6);
      }
      else {
        ppVar5 = (png_bytep)png_calloc(png_ptr,uVar6);
      }
      png_ptr->big_row_buf = ppVar5;
      ppVar5 = (png_bytep)png_malloc(png_ptr,uVar6);
      png_ptr->big_prev_row = ppVar5;
      png_ptr->row_buf =
           (png_bytep)(((ulong)(png_ptr->big_row_buf + 0x20) & 0xfffffffffffffff0) - 1);
      png_ptr->prev_row = (png_bytep)(((ulong)(ppVar5 + 0x20) & 0xfffffffffffffff0) - 1);
      png_ptr->old_big_row_buf_size = uVar6;
    }
    if (png_ptr->rowbytes == 0xffffffffffffffff) {
      error_message = "Row has too many bytes to allocate in memory";
    }
    else {
      memset(png_ptr->prev_row,0,png_ptr->rowbytes + 1);
      ppVar5 = png_ptr->read_buffer;
      if (ppVar5 != (png_bytep)0x0) {
        png_ptr->read_buffer = (png_bytep)0x0;
        png_ptr->read_buffer_size = 0;
        png_free(png_ptr,ppVar5);
      }
      iVar4 = png_inflate_claim(png_ptr,0x49444154);
      if (iVar4 == 0) {
        *(byte *)&png_ptr->flags = (byte)png_ptr->flags | 0x40;
        return;
      }
      error_message = (png_ptr->zstream).msg;
    }
    png_error(png_ptr,error_message);
  }
  png_app_error(png_ptr,"png_start_read_image/png_read_update_info: duplicate call");
  return;
}

Assistant:

void PNGAPI
png_start_read_image(png_structrp png_ptr)
{
   png_debug(1, "in png_start_read_image");

   if (png_ptr != NULL)
   {
      if ((png_ptr->flags & PNG_FLAG_ROW_INIT) == 0)
         png_read_start_row(png_ptr);

      /* New in 1.6.0 this avoids the bug of doing the initializations twice */
      else
         png_app_error(png_ptr,
             "png_start_read_image/png_read_update_info: duplicate call");
   }
}